

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackgroundCommand.h
# Opt level: O2

void __thiscall senjo::PerftCommandHandle::~PerftCommandHandle(PerftCommandHandle *this)

{
  ~PerftCommandHandle(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

PerftCommandHandle(ChessEngine* engine) : BackgroundCommand(engine) { }